

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O3

QAccessibleInterface * __thiscall
QAccessibleMainWindow::childAt(QAccessibleMainWindow *this,int x,int y)

{
  QWidgetData *pQVar1;
  QObject *pQVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  QWidget *pQVar6;
  QAccessibleInterface *pQVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  QPoint local_60;
  QWidgetList local_58;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
  if ((pQVar6->data->widget_attributes & 0x8000) == 0) {
    pQVar7 = (QAccessibleInterface *)0x0;
  }
  else {
    local_58.d.d = (Data *)0x0;
    local_58.d.d = (Data *)QWidget::mapToGlobal(pQVar6,(QPoint *)&local_58);
    pQVar1 = pQVar6->data;
    local_58.d.ptr._0_4_ = ((pQVar1->crect).x2.m_i + (int)local_58.d.d) - (pQVar1->crect).x1.m_i;
    local_58.d.ptr._4_4_ = ((pQVar1->crect).y2.m_i + SUB84(local_58.d.d,4)) - (pQVar1->crect).y1.m_i
    ;
    local_40.yp.m_i = y;
    local_40.xp.m_i = x;
    pQVar7 = (QAccessibleInterface *)0x0;
    cVar5 = QRect::contains((QPoint *)&local_58,SUB81(&local_40,0));
    if (cVar5 != '\0') {
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr._0_4_ = -0x55555556;
      local_58.d.ptr._4_4_ = -0x55555556;
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar6 = (QWidget *)QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
      _q_ac_childWidgets(&local_58,pQVar6);
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar6 = (QWidget *)QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
      local_60.xp.m_i = x;
      local_60.yp.m_i = y;
      local_40 = QWidget::mapFromGlobal(pQVar6,&local_60);
      if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
        pQVar7 = (QAccessibleInterface *)0x0;
      }
      else {
        lVar4 = CONCAT44(local_58.d.ptr._4_4_,(int)local_58.d.ptr);
        lVar9 = local_58.d.size << 3;
        pQVar7 = (QAccessibleInterface *)0x0;
        lVar8 = 0;
        do {
          pQVar2 = *(QObject **)(lVar4 + lVar8);
          lVar3 = *(long *)(pQVar2 + 0x20);
          if ((((*(byte *)(lVar3 + 0xc) & 1) == 0) && ((*(byte *)(lVar3 + 10) & 1) == 0)) &&
             (cVar5 = QRect::contains((QPoint *)(lVar3 + 0x14),SUB81(&local_40,0)), cVar5 != '\0'))
          {
            pQVar7 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar2);
            break;
          }
          lVar8 = lVar8 + 8;
        } while (lVar9 != lVar8);
      }
      if ((QPoint)local_58.d.d != (QPoint)0x0) {
        LOCK();
        *(int *)local_58.d.d = *(int *)local_58.d.d + -1;
        UNLOCK();
        if (*(int *)local_58.d.d == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar7;
}

Assistant:

QAccessibleInterface *QAccessibleMainWindow::childAt(int x, int y) const
{
    QWidget *w = widget();
    if (!w->isVisible())
        return nullptr;
    QPoint gp = w->mapToGlobal(QPoint(0, 0));
    if (!QRect(gp.x(), gp.y(), w->width(), w->height()).contains(x, y))
        return nullptr;

    const QWidgetList kids = _q_ac_childWidgets(mainWindow());
    QPoint rp = mainWindow()->mapFromGlobal(QPoint(x, y));
    for (QWidget *child : kids) {
        if (!child->isWindow() && !child->isHidden() && child->geometry().contains(rp)) {
            return QAccessible::queryAccessibleInterface(child);
        }
    }
    return nullptr;
}